

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

int __thiscall
CVmObjByteArray::getp_packBytes(CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int argc;
  ulong uVar4;
  CVmByteArraySource dst;
  
  if (oargc == (uint *)0x0) {
    argc = -1;
  }
  else {
    argc = *oargc - 1;
  }
  if ((getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar2 = __cxa_guard_acquire(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar2 != 0)) {
    getp_packBytes::desc.min_argc_ = 2;
    getp_packBytes::desc.opt_argc_ = 0;
    getp_packBytes::desc.varargs_ = 1;
    __cxa_guard_release(&getp_packBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_packBytes::desc);
  if (iVar2 == 0) {
    uVar3 = CVmBif::pop_long_val();
    if ((int)uVar3 < 1) {
      uVar4 = 0;
    }
    else {
      uVar1 = *(uint *)(this->super_CVmObject).ext_;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar4 = (ulong)uVar3 - 1;
    }
    dst.super_CVmDataSource._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_003596b8;
    dst.vmg = (vm_globals *)0x0;
    dst.arr = (CVmObjByteArray *)(G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff));
    dst.start_idx = 0;
    dst.end_idx = (long)**(uint **)((long)&G_obj_table_X.pages_[self >> 0xc][self & 0xfff].ptr_ + 8)
    ;
    if ((long)uVar4 < 0) {
      dst.idx = 0;
    }
    else {
      dst.idx = dst.end_idx;
      if (uVar4 <= (ulong)dst.end_idx) {
        dst.idx = uVar4;
      }
    }
    dst.arr_id = self;
    CVmPack::pack(0,argc,&dst.super_CVmDataSource);
    sp_ = sp_ + -(long)argc;
    retval->typ = VM_INT;
    (retval->val).obj = (int)dst.idx - ((int)uVar4 + (int)dst.start_idx);
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_packBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2, 0, TRUE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* adjust to a zero-based index */
    --idx;

    /* set up a data source for the byte array */
    CVmByteArraySource dst(vmg_ self);

    /* seek to the starting index */
    dst.seek(idx, OSFSK_SET);

    /* do the packing */
    CVmPack::pack(vmg_ 0, argc, &dst);

    /* discard the arguments */
    G_stk->discard(argc);

    /* return the number of bytes written */
    retval->set_int(dst.get_pos() - idx);

    /* handled */
    return TRUE;
}